

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_omac.c
# Opt level: O2

int omac_imit_final(EVP_MD_CTX *ctx,uchar *md)

{
  int iVar1;
  undefined8 *puVar2;
  size_t mac_size;
  uchar mac [16];
  
  puVar2 = (undefined8 *)EVP_MD_CTX_get0_md_data();
  mac_size = 0x10;
  iVar1 = *(int *)(puVar2 + 3);
  if (iVar1 == 0) {
    ERR_GOST_error(0x75,0x79,
                   "/workspace/llm4binary/github/license_c_cmakelists/gost-engine[P]engine/gost_omac.c"
                   ,0x59);
  }
  else {
    CMAC_Final((CMAC_CTX *)*puVar2,mac,&mac_size);
    memcpy(md,mac,puVar2[1]);
  }
  return (uint)(iVar1 != 0);
}

Assistant:

static int omac_imit_final(EVP_MD_CTX *ctx, unsigned char *md)
{
    OMAC_CTX *c = EVP_MD_CTX_md_data(ctx);
    unsigned char mac[MAX_GOST_OMAC_SIZE];
    size_t mac_size = sizeof(mac);

    if (!c->key_set) {
        GOSTerr(GOST_F_OMAC_IMIT_FINAL, GOST_R_MAC_KEY_NOT_SET);
        return 0;
    }

    CMAC_Final(c->cmac_ctx, mac, &mac_size);

    memcpy(md, mac, c->dgst_size);
    return 1;
}